

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

void __thiscall
EncodingTable::addEntry(EncodingTable *this,uchar *hex,size_t hexLength,string *value)

{
  long lVar1;
  char *text;
  undefined1 local_48 [8];
  TableEntry entry;
  size_t index;
  string *value_local;
  size_t hexLength_local;
  uchar *hex_local;
  EncodingTable *this_local;
  
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    entry.valueLen =
         std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::size
                   (&this->entries);
    text = (char *)std::__cxx11::string::c_str();
    Trie::insert(&this->lookup,text,entry.valueLen);
    local_48 = (undefined1  [8])ByteArray::append(&this->hexData,hex,hexLength);
    entry.hexPos = hexLength;
    entry.hexLen = std::__cxx11::string::size();
    std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::push_back
              (&this->entries,(value_type *)local_48);
  }
  return;
}

Assistant:

void EncodingTable::addEntry(unsigned char* hex, size_t hexLength, const std::string& value)
{
	if (value.size() == 0)
		return;
	
	// insert into trie
	size_t index = entries.size();
	lookup.insert(value.c_str(),index);

	// add entry
	TableEntry entry;
	entry.hexPos = hexData.append(hex,hexLength);
	entry.hexLen = hexLength;
	entry.valueLen = value.size();

	entries.push_back(entry);
}